

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

Model * gvr::loadPLY(char *name)

{
  bool bVar1;
  ply_type pVar2;
  int iVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_00;
  long lVar4;
  TexturedMesh *pTVar5;
  ulong uVar6;
  ulong uVar7;
  reference pbVar8;
  int __oflag;
  char *in_RDI;
  iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  size_t i;
  string s;
  TexturedMesh *tm;
  Model *model;
  bool multitexture;
  bool texture;
  bool pervertexcolor;
  int tn;
  int vn;
  PLYReader ply;
  string *in_stack_fffffffffffff6b8;
  TexturedMesh *in_stack_fffffffffffff6c0;
  PLYReader *in_stack_fffffffffffff6c8;
  PLYReader *in_stack_fffffffffffff6d0;
  PLYReader *in_stack_fffffffffffff6d8;
  ImageIO *in_stack_fffffffffffff6e0;
  bool local_88d;
  bool local_85d;
  bool local_815;
  bool local_7b5;
  undefined4 in_stack_fffffffffffff870;
  allocator *prefix;
  string local_768 [39];
  undefined1 local_741 [33];
  string local_720 [32];
  string local_700 [32];
  _Self local_6e0;
  _Self local_6d8;
  allocator local_6c9;
  string local_6c8 [32];
  string local_6a8 [80];
  ulong local_658;
  allocator local_649;
  string local_648 [32];
  TexturedMesh *local_628;
  TexturedMesh *local_620;
  byte local_613;
  byte local_612;
  allocator local_611;
  string local_610 [37];
  byte local_5eb;
  byte local_5ea;
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [37];
  byte local_573;
  byte local_572;
  allocator local_571;
  string local_570 [37];
  byte local_54b;
  byte local_54a;
  allocator local_549;
  string local_548 [37];
  byte local_523;
  byte local_522;
  allocator local_521;
  string local_520 [37];
  byte local_4fb;
  byte local_4fa;
  allocator local_4f9;
  string local_4f8 [37];
  byte local_4d3;
  byte local_4d2;
  allocator local_4d1;
  string local_4d0 [37];
  byte local_4ab;
  byte local_4aa;
  allocator local_4a9;
  string local_4a8 [37];
  byte local_483;
  byte local_482;
  allocator local_481;
  string local_480 [37];
  byte local_45b;
  byte local_45a;
  allocator local_459;
  string local_458 [37];
  byte local_433;
  byte local_432;
  allocator local_431;
  string local_430 [37];
  byte local_40b;
  byte local_40a;
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [36];
  byte local_394;
  byte local_393;
  byte local_392;
  allocator local_391;
  string local_390 [37];
  byte local_36b;
  byte local_36a;
  allocator local_369;
  string local_368 [37];
  byte local_343;
  byte local_342;
  allocator local_341;
  string local_340 [37];
  byte local_31b;
  byte local_31a;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [38];
  byte local_2a2;
  allocator local_2a1;
  string local_2a0 [32];
  int local_280;
  allocator local_279;
  string local_278 [32];
  int local_258;
  PLYReader local_248;
  char *local_8;
  
  local_8 = in_RDI;
  PLYReader::PLYReader(in_stack_fffffffffffff6d0);
  PLYReader::open(&local_248,local_8,__oflag);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"vertex",&local_279);
  list_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)PLYReader::instancesOfElement
                         (in_stack_fffffffffffff6c8,(string *)in_stack_fffffffffffff6c0);
  iVar3 = (int)list_00;
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  prefix = &local_2a1;
  local_258 = iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"face",prefix);
  lVar4 = PLYReader::instancesOfElement
                    (in_stack_fffffffffffff6c8,(string *)in_stack_fffffffffffff6c0);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  local_280 = (int)lVar4;
  std::allocator<char>::allocator();
  local_31a = 0;
  local_31b = 0;
  local_342 = 0;
  local_343 = 0;
  local_36a = 0;
  local_36b = 0;
  local_392 = 0;
  local_393 = 0;
  std::__cxx11::string::string(local_2c8,"vertex",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"diffuse_red",&local_2f1);
  pVar2 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                     &in_stack_fffffffffffff6c8->filename);
  local_7b5 = true;
  if (pVar2 == ply_none) {
    std::allocator<char>::allocator();
    local_31a = 1;
    std::__cxx11::string::string(local_318,"vertex",&local_319);
    local_31b = 1;
    std::allocator<char>::allocator();
    local_342 = 1;
    std::__cxx11::string::string(local_340,"red",&local_341);
    local_343 = 1;
    pVar2 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                       &in_stack_fffffffffffff6c8->filename);
    local_7b5 = true;
    if (pVar2 == ply_none) {
      std::allocator<char>::allocator();
      local_36a = 1;
      std::__cxx11::string::string(local_368,"vertex",&local_369);
      local_36b = 1;
      std::allocator<char>::allocator();
      local_392 = 1;
      std::__cxx11::string::string(local_390,"r",&local_391);
      local_393 = 1;
      pVar2 = PLYReader::getTypeOfProperty
                        (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                         &in_stack_fffffffffffff6c8->filename);
      local_7b5 = pVar2 != ply_none;
    }
  }
  if ((local_393 & 1) != 0) {
    std::__cxx11::string::~string(local_390);
  }
  if ((local_392 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
  }
  if ((local_36b & 1) != 0) {
    std::__cxx11::string::~string(local_368);
  }
  if ((local_36a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
  }
  if ((local_343 & 1) != 0) {
    std::__cxx11::string::~string(local_340);
  }
  if ((local_342 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
  }
  if ((local_31b & 1) != 0) {
    std::__cxx11::string::~string(local_318);
  }
  if ((local_31a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
  }
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  local_2a2 = local_7b5;
  std::allocator<char>::allocator();
  local_40a = 0;
  local_40b = 0;
  local_432 = 0;
  local_433 = 0;
  local_45a = 0;
  local_45b = 0;
  local_482 = 0;
  local_483 = 0;
  local_4aa = 0;
  local_4ab = 0;
  local_4d2 = 0;
  local_4d3 = 0;
  local_4fa = 0;
  local_4fb = 0;
  local_522 = 0;
  local_523 = 0;
  local_54a = 0;
  local_54b = 0;
  local_572 = 0;
  local_573 = 0;
  std::__cxx11::string::string(local_3b8,"vertex",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"u",&local_3e1);
  pVar2 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                     &in_stack_fffffffffffff6c8->filename);
  if (pVar2 != ply_none) {
    std::allocator<char>::allocator();
    local_40a = 1;
    std::__cxx11::string::string(local_408,"vertex",&local_409);
    local_40b = 1;
    std::allocator<char>::allocator();
    local_432 = 1;
    std::__cxx11::string::string(local_430,"v",&local_431);
    local_433 = 1;
    pVar2 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                       &in_stack_fffffffffffff6c8->filename);
    local_815 = true;
    if (pVar2 != ply_none) goto LAB_001503c6;
  }
  std::allocator<char>::allocator();
  local_45a = 1;
  std::__cxx11::string::string(local_458,"vertex",&local_459);
  local_45b = 1;
  std::allocator<char>::allocator();
  local_482 = 1;
  std::__cxx11::string::string(local_480,"texture_u",&local_481);
  local_483 = 1;
  pVar2 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                     &in_stack_fffffffffffff6c8->filename);
  if (pVar2 != ply_none) {
    std::allocator<char>::allocator();
    local_4aa = 1;
    std::__cxx11::string::string(local_4a8,"vertex",&local_4a9);
    local_4ab = 1;
    std::allocator<char>::allocator();
    local_4d2 = 1;
    std::__cxx11::string::string(local_4d0,"texture_v",&local_4d1);
    local_4d3 = 1;
    pVar2 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                       &in_stack_fffffffffffff6c8->filename);
    local_815 = true;
    if (pVar2 != ply_none) goto LAB_001503c6;
  }
  std::allocator<char>::allocator();
  local_4fa = 1;
  std::__cxx11::string::string(local_4f8,"vertex",&local_4f9);
  local_4fb = 1;
  std::allocator<char>::allocator();
  local_522 = 1;
  std::__cxx11::string::string(local_520,"s",&local_521);
  local_523 = 1;
  pVar2 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                     &in_stack_fffffffffffff6c8->filename);
  local_85d = false;
  if (pVar2 != ply_none) {
    std::allocator<char>::allocator();
    local_54a = 1;
    std::__cxx11::string::string(local_548,"vertex",&local_549);
    local_54b = 1;
    std::allocator<char>::allocator();
    local_572 = 1;
    std::__cxx11::string::string(local_570,"t",&local_571);
    local_573 = 1;
    pVar2 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                       &in_stack_fffffffffffff6c8->filename);
    local_85d = pVar2 != ply_none;
  }
  local_815 = local_85d;
LAB_001503c6:
  if ((local_573 & 1) != 0) {
    std::__cxx11::string::~string(local_570);
  }
  if ((local_572 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
  }
  if ((local_54b & 1) != 0) {
    std::__cxx11::string::~string(local_548);
  }
  if ((local_54a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
  }
  if ((local_523 & 1) != 0) {
    std::__cxx11::string::~string(local_520);
  }
  if ((local_522 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
  }
  if ((local_4fb & 1) != 0) {
    std::__cxx11::string::~string(local_4f8);
  }
  if ((local_4fa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  }
  if ((local_4d3 & 1) != 0) {
    std::__cxx11::string::~string(local_4d0);
  }
  if ((local_4d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  }
  if ((local_4ab & 1) != 0) {
    std::__cxx11::string::~string(local_4a8);
  }
  if ((local_4aa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  }
  if ((local_483 & 1) != 0) {
    std::__cxx11::string::~string(local_480);
  }
  if ((local_482 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
  }
  if ((local_45b & 1) != 0) {
    std::__cxx11::string::~string(local_458);
  }
  if ((local_45a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
  }
  if ((local_433 & 1) != 0) {
    std::__cxx11::string::~string(local_430);
  }
  if ((local_432 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
  }
  if ((local_40b & 1) != 0) {
    std::__cxx11::string::~string(local_408);
  }
  if ((local_40a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
  }
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  local_394 = local_815;
  std::allocator<char>::allocator();
  local_5ea = 0;
  local_5eb = 0;
  local_612 = 0;
  local_613 = 0;
  std::__cxx11::string::string(local_598,"face",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"texcoord",&local_5c1);
  pVar2 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                     &in_stack_fffffffffffff6c8->filename);
  local_88d = false;
  if (pVar2 != ply_none) {
    std::allocator<char>::allocator();
    local_5ea = 1;
    std::__cxx11::string::string(local_5e8,"face",&local_5e9);
    local_5eb = 1;
    std::allocator<char>::allocator();
    local_612 = 1;
    std::__cxx11::string::string(local_610,"texnumber",&local_611);
    local_613 = 1;
    pVar2 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff6d8,&in_stack_fffffffffffff6d0->filename,
                       &in_stack_fffffffffffff6c8->filename);
    local_88d = pVar2 != ply_none;
  }
  if ((local_613 & 1) != 0) {
    std::__cxx11::string::~string(local_610);
  }
  if ((local_612 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
  }
  if ((local_5eb & 1) != 0) {
    std::__cxx11::string::~string(local_5e8);
  }
  if ((local_5ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  }
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  local_598[0x24] = (string)local_88d;
  local_620 = (TexturedMesh *)0x0;
  local_628 = (TexturedMesh *)0x0;
  if (0 < local_258) {
    if (local_280 < 1) {
      if ((local_2a2 & 1) == 0) {
        pTVar5 = (TexturedMesh *)operator_new(0xa8);
        PointCloud::PointCloud((PointCloud *)in_stack_fffffffffffff6c0);
        local_620 = pTVar5;
      }
      else {
        pTVar5 = (TexturedMesh *)operator_new(0xb0);
        ColoredPointCloud::ColoredPointCloud((ColoredPointCloud *)in_stack_fffffffffffff6c0);
        local_620 = pTVar5;
      }
    }
    else if (local_88d == false) {
      if ((local_394 & 1) == 0) {
        if ((local_2a2 & 1) == 0) {
          pTVar5 = (TexturedMesh *)operator_new(0xc0);
          Mesh::Mesh(&in_stack_fffffffffffff6c0->super_Mesh);
          local_620 = pTVar5;
        }
        else {
          pTVar5 = (TexturedMesh *)operator_new(200);
          ColoredMesh::ColoredMesh((ColoredMesh *)in_stack_fffffffffffff6c0);
          local_620 = pTVar5;
        }
      }
      else {
        pTVar5 = (TexturedMesh *)operator_new(0x108);
        TexturedMesh::TexturedMesh(in_stack_fffffffffffff6c0);
        local_628 = pTVar5;
        local_620 = pTVar5;
      }
    }
    else {
      pTVar5 = (TexturedMesh *)operator_new(0x100);
      MultiTexturedMesh::MultiTexturedMesh((MultiTexturedMesh *)in_stack_fffffffffffff6c0);
      local_620 = pTVar5;
    }
    (*(local_620->super_Mesh).super_PointCloud.super_Model._vptr_Model[6])(local_620,&local_248);
  }
  if (local_628 != (TexturedMesh *)0x0) {
    TexturedMesh::getTextureName_abi_cxx11_(local_628);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_648,local_8,&local_649);
      std::allocator<char>::~allocator((allocator<char> *)&local_649);
      uVar6 = std::__cxx11::string::rfind((char)local_648,0x2e);
      local_658 = uVar6;
      uVar7 = std::__cxx11::string::size();
      if (uVar6 < uVar7) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x15137d);
        std::__cxx11::string::substr((ulong)local_6a8,(ulong)local_648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6c8,"",&local_6c9);
        gutil::getFileList(list_00,(string *)prefix,
                           (string *)CONCAT44(iVar3,in_stack_fffffffffffff870));
        std::__cxx11::string::~string(local_6c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
        std::__cxx11::string::~string(local_6a8);
        local_6d8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff6b8);
        while( true ) {
          local_6e0._M_node =
               (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff6b8);
          bVar1 = std::operator!=(&local_6d8,&local_6e0);
          if (!bVar1) break;
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff6c0);
          iVar3 = std::__cxx11::string::compare(local_648);
          if (iVar3 != 0) {
            gimage::getImageIO();
            std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1514a7);
            std::__cxx11::string::c_str();
            bVar1 = gimage::ImageIO::handlesFile
                              (in_stack_fffffffffffff6e0,(char *)in_stack_fffffffffffff6d8,
                               SUB81((ulong)in_stack_fffffffffffff6d0 >> 0x38,0));
            if (bVar1) {
              pbVar8 = std::
                       _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)in_stack_fffffffffffff6c0);
              std::__cxx11::string::operator=(local_648,(string *)pbVar8);
              local_658 = std::__cxx11::string::rfind((char)local_648,0x2f);
              if (local_658 == 0xffffffffffffffff) {
                local_658 = std::__cxx11::string::rfind((char)local_648,0x5c);
              }
              if (local_658 == 0xffffffffffffffff) {
                in_stack_fffffffffffff6d0 = (PLYReader *)local_741;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)(local_741 + 1),"",(allocator *)in_stack_fffffffffffff6d0);
                TexturedMesh::setBasePath(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
                std::__cxx11::string::~string((string *)(local_741 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_741);
                pTVar5 = local_628;
                std::__cxx11::string::string(local_768,local_648);
                TexturedMesh::setTextureName(pTVar5,in_stack_fffffffffffff6b8);
                std::__cxx11::string::~string(local_768);
              }
              else {
                std::__cxx11::string::substr((ulong)local_700,(ulong)local_648);
                TexturedMesh::setBasePath(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
                std::__cxx11::string::~string(local_700);
                std::__cxx11::string::substr((ulong)local_720,(ulong)local_648);
                TexturedMesh::setTextureName(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
                std::__cxx11::string::~string(local_720);
              }
              break;
            }
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff6c0);
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x151824);
      }
      std::__cxx11::string::~string(local_648);
    }
  }
  PLYReader::~PLYReader(in_stack_fffffffffffff6d0);
  return (Model *)local_620;
}

Assistant:

Model *loadPLY(const char *name)
{
  PLYReader ply;

  ply.open(name);

  // determine data type

  int vn=static_cast<int>(ply.instancesOfElement("vertex"));
  int tn=static_cast<int>(ply.instancesOfElement("face"));

  bool pervertexcolor=ply.getTypeOfProperty("vertex", "diffuse_red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "r") != ply_none;

  bool texture=(ply.getTypeOfProperty("vertex", "u") != ply_none &&
                ply.getTypeOfProperty("vertex", "v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "texture_u") != ply_none &&
                ply.getTypeOfProperty("vertex", "texture_v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "s") != ply_none &&
                ply.getTypeOfProperty("vertex", "t") != ply_none);

  bool multitexture=ply.getTypeOfProperty("face", "texcoord") != ply_none &&
                    ply.getTypeOfProperty("face", "texnumber") != ply_none;

  // create best data type

  Model *model=0;
  TexturedMesh *tm=0;

  if (vn > 0)
  {
    if (tn > 0)
    {
      if (multitexture)
      {
        model=new MultiTexturedMesh();
      }
      else if (texture)
      {
        model=tm=new TexturedMesh();
      }
      else if (pervertexcolor)
      {
        model=new ColoredMesh();
      }
      else
      {
        model=new Mesh();
      }
    }
    else
    {
      if (pervertexcolor)
      {
        model=new ColoredPointCloud();
      }
      else
      {
        model=new PointCloud();
      }
    }

    // load from PLY into the allocated data set

    model->loadPLY(ply);
  }

  // optionally try to guess the name of the texture from the file name

  if (tm != 0 && tm->getTextureName().size() == 0)
  {
    std::string s=name;
    size_t i=s.rfind('.');

    if (i < s.size())
    {
      std::set<std::string> list;
      gutil::getFileList(list, s.substr(0, i+1), "");

      for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
      {
        if (s.compare(*it) != 0  && gimage::getImageIO().handlesFile(it->c_str(), true))
        {
          s=*it;

          i=s.rfind('/');

          if (i == s.npos)
          {
            i=s.rfind('\\');
          }

          if (i != s.npos)
          {
            tm->setBasePath(s.substr(0, i+1));
            tm->setTextureName(s.substr(i+1));
          }
          else
          {
            tm->setBasePath("");
            tm->setTextureName(s);
          }

          break;
        }
      }
    }
  }

  return model;
}